

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

BOOL __thiscall
Js::TypedArrayBase::ValidateIndexAndDirectSetItem
          (TypedArrayBase *this,Var index,Var value,bool *isNumericIndex)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uint32 uVar1;
  int iVar2;
  ulong in_RAX;
  undefined8 uStack_28;
  bool skipSetItem;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  uVar1 = ValidateAndReturnIndex(this,index,(bool *)((long)&uStack_28 + 7),isNumericIndex);
  if (*isNumericIndex == true) {
    UNRECOVERED_JUMPTABLE =
         (this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
         super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
         _vptr_IRecyclerVisitedObject[(uStack_28 >> 0x38) + 0x70];
    iVar2 = (*UNRECOVERED_JUMPTABLE)(this,(ulong)uVar1,value,UNRECOVERED_JUMPTABLE);
    return iVar2;
  }
  return 1;
}

Assistant:

_Use_decl_annotations_ BOOL TypedArrayBase::ValidateIndexAndDirectSetItem(Js::Var index, Js::Var value, bool * isNumericIndex)
    {
        bool skipSetItem = false;
        uint32 indexToSet = ValidateAndReturnIndex(index, &skipSetItem, isNumericIndex);

        // If index is not numeric, goto [[Set]] property path
        if (*isNumericIndex)
        {
            return skipSetItem ?
                DirectSetItemNoSet(indexToSet, value) :
                DirectSetItem(indexToSet, value);
        }
        else
        {
            return TRUE;
        }
    }